

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O0

void libdef_func(BuildCtx *ctx,char *p,int arg)

{
  uint8_t *puVar1;
  uint uVar2;
  size_t sVar3;
  int in_EDX;
  char *pcVar4;
  char *in_RSI;
  long in_RDI;
  bool bVar5;
  int i;
  int in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  FILE *__stream;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  BuildCtx *in_stack_ffffffffffffffe0;
  int local_18;
  
  if (in_EDX != 0) {
    ffasmfunc = ffasmfunc + 1;
  }
  if (*(int *)(in_RDI + 8) == 7) {
    if (modstate == 0) {
      fprintf(_stderr,"Error: no module for function definition %s\n",in_RSI);
      exit(1);
    }
    if (regfunc == 1) {
      if (&optr < optr + 1) {
        fprintf(_stderr,"Error: output buffer overflow\n");
        exit(1);
      }
      puVar1 = optr + 1;
      *optr = 0xfe;
      optr = puVar1;
    }
    else {
      if (in_EDX != 0x80) {
        if (modstate != 1) {
          fprintf(*(FILE **)(in_RDI + 0x10),",\n");
        }
        modstate = 2;
        pcVar4 = "lj_cf_";
        if (in_EDX != 0) {
          pcVar4 = "lj_ffh_";
        }
        fprintf(*(FILE **)(in_RDI + 0x10),"  %s%s",pcVar4,in_RSI);
      }
      if (regfunc != 2) {
        obuf[2] = obuf[2] + '\x01';
      }
      libdef_name(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    }
  }
  else if (*(int *)(in_RDI + 8) == 6) {
    fprintf(*(FILE **)(in_RDI + 0x10),"FFDEF(%s)\n",in_RSI);
  }
  else if (*(int *)(in_RDI + 8) == 8) {
    sVar3 = strlen(in_RSI);
    if (0x4f < sVar3) {
      fprintf(_stderr,"Error: function name too long: \'%s\'\n",in_RSI);
      exit(1);
    }
    strcpy(funcname,in_RSI);
  }
  else if (*(int *)(in_RDI + 8) == 9) {
    local_18 = 1;
    while( true ) {
      bVar5 = false;
      if (in_RSI[local_18] != '\0') {
        bVar5 = modname[local_18 + -1] != '\0';
      }
      if (!bVar5) break;
      if (in_RSI[local_18] == '_') {
        in_RSI[local_18] = '.';
      }
      local_18 = local_18 + 1;
    }
    fprintf(*(FILE **)(in_RDI + 0x10),"\"%s\",\n",in_RSI);
  }
  else if ((*(int *)(in_RDI + 8) == 5) && (in_EDX != 0)) {
    __stream = *(FILE **)(in_RDI + 0x10);
    uVar2 = find_ffofs(in_stack_ffffffffffffffe0,
                       (char *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
    fprintf(__stream,",\n%d",(ulong)uVar2);
  }
  ffid = ffid + 1;
  regfunc = 0;
  return;
}

Assistant:

static void libdef_func(BuildCtx *ctx, char *p, int arg)
{
  if (arg != LIBINIT_CF)
    ffasmfunc++;
  if (ctx->mode == BUILD_libdef) {
    if (modstate == 0) {
      fprintf(stderr, "Error: no module for function definition %s\n", p);
      exit(1);
    }
    if (regfunc == REGFUNC_NOREG) {
      if (optr+1 > obuf+sizeof(obuf)) {
	fprintf(stderr, "Error: output buffer overflow\n");
	exit(1);
      }
      *optr++ = LIBINIT_FFID;
    } else {
      if (arg != LIBINIT_ASM_) {
	if (modstate != 1) fprintf(ctx->fp, ",\n");
	modstate = 2;
	fprintf(ctx->fp, "  %s%s", arg ? LABEL_PREFIX_FFH : LABEL_PREFIX_CF, p);
      }
      if (regfunc != REGFUNC_NOREGUV) obuf[2]++;  /* Bump hash table size. */
      libdef_name(regfunc == REGFUNC_NOREGUV ? "" : p, arg);
    }
  } else if (ctx->mode == BUILD_ffdef) {
    fprintf(ctx->fp, "FFDEF(%s)\n", p);
  } else if (ctx->mode == BUILD_recdef) {
    if (strlen(p) > sizeof(funcname)-1) {
      fprintf(stderr, "Error: function name too long: '%s'\n", p);
      exit(1);
    }
    strcpy(funcname, p);
  } else if (ctx->mode == BUILD_vmdef) {
    int i;
    for (i = 1; p[i] && modname[i-1]; i++)
      if (p[i] == '_') p[i] = '.';
    fprintf(ctx->fp, "\"%s\",\n", p);
  } else if (ctx->mode == BUILD_bcdef) {
    if (arg != LIBINIT_CF)
      fprintf(ctx->fp, ",\n%d", find_ffofs(ctx, p));
  }
  ffid++;
  regfunc = REGFUNC_OK;
}